

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_selist.c
# Opt level: O2

void test_push_doesnt_invalidate_iterator(CuTest *tc)

{
  void *actual;
  char *data;
  long lVar1;
  int qi;
  selist *local_40;
  selist *list;
  
  list = (selist *)0x0;
  qi = 0;
  selist_push(&list,
              "Lorem ipsum dolor sit amet, consectetur adipisicing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua."
             );
  local_40 = list;
  data = 
  "Lorem ipsum dolor sit amet, consectetur adipisicing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua."
  ;
  for (lVar1 = 0; data = data + 2, lVar1 != 0x2a; lVar1 = lVar1 + 1) {
    actual = selist_get(local_40,qi);
    CuAssertPtrEquals_LineMsg
              (tc,
               "/workspace/llm4binary/github/license_c_cmakelists/ennorehling[P]clibs/test_selist.c"
               ,0xca,(char *)0x0,
               "Lorem ipsum dolor sit amet, consectetur adipisicing elit, sed do eiusmod tempor incididunt ut labore et dolore magna aliqua."
               + lVar1,actual);
    selist_push(&list,data + -1);
    selist_advance(&local_40,&qi,1);
    selist_push(&list,data);
  }
  selist_free(local_40);
  return;
}

Assistant:

static void test_push_doesnt_invalidate_iterator(CuTest * tc)
{
    struct selist *list = NULL, *ql = NULL;
    int i, qi = 0;
    selist_push(&list, (void*)lipsum);
    ql = list;
    for (i = 0; i != 42; ++i) {
        void * n;
        n = selist_get(ql, qi);
        CuAssertPtrEquals(tc, (void *)(lipsum + i), n);
        selist_push(&list, (void *)(lipsum + (i * 2 + 1)));
        selist_advance(&ql, &qi, 1);
        selist_push(&list, (void *)(lipsum + (i * 2 + 2)));
    }
    selist_free(ql);
}